

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

long get_cost(obj *obj,monst *shkp)

{
  ushort uVar1;
  schar sVar2;
  boolean bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  long lStack_40;
  
  lVar5 = getprice(obj,'\0');
  lVar9 = 5;
  if (lVar5 != 0) {
    lVar9 = lVar5;
  }
  lStack_40 = 3;
  if (((obj->field_0x4a & 0x20) != 0) && ((objects[obj->otyp].field_0x10 & 1) != 0))
  goto LAB_0022db73;
  if ((obj->oclass != '\r') ||
     (uVar1 = obj->otyp, (*(ushort *)&objects[(short)uVar1].field_0x11 & 0x1f0) != 0x130)) {
    if ((obj->o_id & 3) == 0) {
      lVar9 = lVar9 + lVar9 / 3;
    }
    goto LAB_0022db73;
  }
  iVar7 = (int)u.ubirthday % (int)(short)uVar1;
  if (8 < uVar1 - 0x206) {
    warning("bad glass gem %d?");
    uVar8 = 0;
    goto LAB_0022db69;
  }
  iVar4 = (int)((short)uVar1 / 2);
  switch((uint)uVar1) {
  case 0x206:
    bVar10 = iVar7 - iVar4 < 0;
    uVar6 = 0x1fd;
    uVar8 = 0x1f1;
    break;
  case 0x207:
    uVar8 = (ulong)(iVar7 < iVar4) * 5 + 500;
    goto LAB_0022db69;
  case 0x208:
    bVar10 = iVar7 - iVar4 < 0;
    uVar6 = 0x201;
    uVar8 = 0x1f2;
    break;
  case 0x209:
    uVar8 = (ulong)(iVar7 < iVar4) | 0x1fa;
    goto LAB_0022db69;
  case 0x20a:
    bVar10 = iVar7 - iVar4 < 0;
    uVar6 = 0x204;
    uVar8 = 499;
    break;
  case 0x20b:
    bVar10 = iVar7 - iVar4 < 0;
    uVar6 = 0x1fe;
    uVar8 = 0x1f8;
    break;
  case 0x20c:
    bVar10 = iVar7 - iVar4 < 0;
    uVar6 = 0x1fc;
    uVar8 = 0x1f5;
    break;
  case 0x20d:
    bVar10 = iVar7 - iVar4 < 0;
    uVar6 = 0x205;
    uVar8 = 0x1f6;
    break;
  case 0x20e:
    uVar8 = (ulong)(iVar7 < iVar4) * 2 + 0x200;
    goto LAB_0022db69;
  }
  if (SBORROW4(iVar7,iVar4) != bVar10) {
    uVar8 = uVar6;
  }
LAB_0022db69:
  lVar9 = (long)objects[uVar8].oc_cost;
LAB_0022db73:
  if ((((urole.malenum == 0x166) && (u.ulevel < 0xf)) ||
      ((uarmu != (obj *)0x0 && ((uarm == (obj *)0x0 && (uarmc == (obj *)0x0)))))) ||
     ((uarmh != (obj *)0x0 && (uarmh->otyp == 0x4d)))) {
    lVar9 = lVar9 + lVar9 / 3;
  }
  sVar2 = acurr(5);
  if ('\x12' < sVar2) {
    lVar9 = lVar9 / 2;
    goto LAB_0022dc26;
  }
  sVar2 = acurr(5);
  if (sVar2 < '\x12') {
    sVar2 = acurr(5);
    if (sVar2 < '\x10') {
      sVar2 = acurr(5);
      if (sVar2 < '\x06') {
        lVar9 = lVar9 * 2;
        goto LAB_0022dc26;
      }
      sVar2 = acurr(5);
      if (sVar2 < '\b') {
        lStack_40 = 2;
      }
      else {
        sVar2 = acurr(5);
        if ('\n' < sVar2) goto LAB_0022dc26;
      }
    }
    else {
      lStack_40 = -4;
    }
  }
  else {
    lStack_40 = -3;
  }
  lVar9 = lVar9 + lVar9 / lStack_40;
LAB_0022dc26:
  if (lVar9 < 1) {
    lVar5 = 1;
  }
  else {
    lVar5 = lVar9 * 4;
    if (obj->oartifact == '\0') {
      lVar5 = lVar9;
    }
  }
  if ((shkp != (monst *)0x0) && (*(char *)((long)&shkp[0x1b].meating + 2) != '\0')) {
    lVar5 = lVar5 + (lVar5 + 2U) / 3;
  }
  bVar3 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
  if (bVar3 != '\0') {
    if (((((byte)obj->oclass < 0xc) && ((0xf30U >> ((byte)obj->oclass & 0x1f) & 1) != 0)) ||
        ((ushort)(obj->otyp - 0x20fU) < 2)) || ((objects[obj->otyp].field_0x10 & 0x10) != 0)) {
      lVar5 = lVar5 * 0x32;
    }
    else {
      lVar5 = lVar5 * 0x19;
    }
  }
  return lVar5;
}

Assistant:

static long get_cost(const struct obj *obj,
		     struct monst *shkp) /* if angry, impose a surcharge */
{
	long tmp = getprice(obj, FALSE);

	if (!tmp) tmp = 5L;
	/* shopkeeper may notice if the player isn't very knowledgeable -
	   especially when gem prices are concerned */
	if (!obj->dknown || !objects[obj->otyp].oc_name_known) {
		if (obj->oclass == GEM_CLASS &&
			objects[obj->otyp].oc_material == GLASS) {
		    int i;
		    /* get a value that's 'random' from game to game, but the
		       same within the same game */
		    boolean pseudorand =
			(((int)u.ubirthday % obj->otyp) >= obj->otyp/2);

		    /* all gems are priced high - real or not */
		    switch(obj->otyp - LAST_GEM) {
			case 1: /* white */
			    i = pseudorand ? DIAMOND : OPAL;
			    break;
			case 2: /* blue */
			    i = pseudorand ? SAPPHIRE : AQUAMARINE;
			    break;
			case 3: /* red */
			    i = pseudorand ? RUBY : JASPER;
			    break;
			case 4: /* yellowish brown */
			    i = pseudorand ? AMBER : TOPAZ;
			    break;
			case 5: /* orange */
			    i = pseudorand ? JACINTH : AGATE;
			    break;
			case 6: /* yellow */
			    i = pseudorand ? CITRINE : CHRYSOBERYL;
			    break;
			case 7: /* black */
			    i = pseudorand ? BLACK_OPAL : JET;
			    break;
			case 8: /* green */
			    i = pseudorand ? EMERALD : JADE;
			    break;
			case 9: /* violet */
			    i = pseudorand ? AMETHYST : FLUORITE;
			    break;
			default: warning("bad glass gem %d?", obj->otyp);
			    i = STRANGE_OBJECT;
			    break;
		    }
		    tmp = (long) objects[i].oc_cost;
		} else if (!(obj->o_id % 4)) /* arbitrarily impose surcharge */
		    tmp += tmp / 3L;
	}
	if ((Role_if (PM_TOURIST) && u.ulevel < (MAXULEV/2))
	    || (uarmu && !uarm && !uarmc))	/* touristy shirt visible */
		tmp += tmp / 3L;
	else if (uarmh && uarmh->otyp == DUNCE_CAP)
		tmp += tmp / 3L;

	if (ACURR(A_CHA) > 18)		tmp /= 2L;
	else if (ACURR(A_CHA) > 17)	tmp -= tmp / 3L;
	else if (ACURR(A_CHA) > 15)	tmp -= tmp / 4L;
	else if (ACURR(A_CHA) < 6)	tmp *= 2L;
	else if (ACURR(A_CHA) < 8)	tmp += tmp / 2L;
	else if (ACURR(A_CHA) < 11)	tmp += tmp / 3L;
	if (tmp <= 0L) tmp = 1L;
	else if (obj->oartifact) tmp *= 4L;
	/* anger surcharge should match rile_shk's */
	if (shkp && ESHK(shkp)->surcharge) tmp += (tmp + 2L) / 3L;

	/* Big mark-up for Black Market items. */
	if (Is_blackmarket(&u.uz)) {
	    if (obj->oclass==RING_CLASS    || obj->oclass==AMULET_CLASS   ||
		obj->oclass==POTION_CLASS  || obj->oclass==SCROLL_CLASS   ||
		obj->oclass==SPBOOK_CLASS  || obj->oclass==WAND_CLASS     ||
		obj->otyp==LUCKSTONE       || obj->otyp==LOADSTONE        ||
		objects[obj->otyp].oc_magic) {
		tmp *= 50;
	    } else {
		tmp *= 25;
	    }
	}

	return tmp;
}